

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O0

void __thiscall Camera::Control(Camera *this,GLFWwindow *window,float delta)

{
  double dVar1;
  int iVar2;
  ImGuiContext *pIVar3;
  Camera *in_RDI;
  float in_XMM0_Da;
  float fVar4;
  float offset_y;
  float offset_x;
  float speed;
  dvec2 cur_pos;
  float in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  double local_28;
  double local_20;
  
  glfwGetCursorPos((GLFWwindow *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (double *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                   (double *)in_RDI);
  pIVar3 = ImGui::GetCurrentContext();
  if ((pIVar3->NavWindow == (ImGuiWindow *)0x0) ||
     (pIVar3 = ImGui::GetCurrentContext(), (pIVar3->NavWindow->Flags & 0x2000U) != 0)) {
    fVar4 = in_XMM0_Da * in_RDI->m_speed;
    iVar2 = glfwGetKey((GLFWwindow *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (int)((ulong)in_RDI >> 0x20));
    if (iVar2 == 1) {
      move_forward(in_RDI,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    }
    iVar2 = glfwGetKey((GLFWwindow *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (int)((ulong)in_RDI >> 0x20));
    if (iVar2 == 1) {
      move_forward(in_RDI,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    }
    iVar2 = glfwGetKey((GLFWwindow *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (int)((ulong)in_RDI >> 0x20));
    if (iVar2 == 1) {
      move_forward(in_RDI,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    }
    iVar2 = glfwGetKey((GLFWwindow *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (int)((ulong)in_RDI >> 0x20));
    if (iVar2 == 1) {
      move_forward(in_RDI,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    }
    iVar2 = glfwGetKey((GLFWwindow *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (int)((ulong)in_RDI >> 0x20));
    if (iVar2 == 1) {
      (in_RDI->m_position).field_1.y = fVar4 + (in_RDI->m_position).field_1.y;
    }
    iVar2 = glfwGetKey((GLFWwindow *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (int)((ulong)in_RDI >> 0x20));
    if (iVar2 == 1) {
      (in_RDI->m_position).field_1.y = (in_RDI->m_position).field_1.y - fVar4;
    }
    iVar2 = glfwGetMouseButton((GLFWwindow *)
                               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                               (int)((ulong)in_RDI >> 0x20));
    if (iVar2 != 0) {
      glfwGetCursorPos((GLFWwindow *)CONCAT44(fVar4,in_stack_ffffffffffffffd0),
                       (double *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (double *)in_RDI);
      dVar1 = (in_RDI->m_last_mouse_pos).field_1.y;
      in_RDI->m_yaw =
           in_RDI->m_yaw -
           (float)(local_28 - (in_RDI->m_last_mouse_pos).field_0.x) * in_RDI->m_sensitivity;
      in_RDI->m_pitch = in_RDI->m_pitch - (float)(local_20 - dVar1) * in_RDI->m_sensitivity;
      fVar4 = glm::clamp<float>((float)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0),
                                in_stack_ffffffffffffffbc);
      in_RDI->m_pitch = fVar4;
      fVar4 = glm::mod<float>((float)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0));
      in_RDI->m_yaw = fVar4;
    }
  }
  (in_RDI->m_last_mouse_pos).field_0.x = local_28;
  (in_RDI->m_last_mouse_pos).field_1.y = local_20;
  return;
}

Assistant:

void Camera::Control(GLFWwindow *window, float delta) {
	glm::dvec2 cur_pos;
	glfwGetCursorPos(window, &cur_pos.x, &cur_pos.y);

	if (!ImGui::GetCurrentContext()->NavWindow ||
	    (ImGui::GetCurrentContext()->NavWindow->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) {
		float speed = delta * m_speed;
		if (glfwGetKey(window, GLFW_KEY_W) == GLFW_PRESS)
			move_forward(speed, 0.0f);
		if (glfwGetKey(window, GLFW_KEY_A) == GLFW_PRESS)
			move_forward(speed, PIF * 0.5f);
		if (glfwGetKey(window, GLFW_KEY_D) == GLFW_PRESS)
			move_forward(speed, -PIF * 0.5f);
		if (glfwGetKey(window, GLFW_KEY_S) == GLFW_PRESS)
			move_forward(speed, PIF);
		if (glfwGetKey(window, GLFW_KEY_SPACE) == GLFW_PRESS)
			m_position.y += speed;
		if (glfwGetKey(window, GLFW_KEY_LEFT_SHIFT) == GLFW_PRESS)
			m_position.y -= speed;

		if (glfwGetMouseButton(window, GLFW_MOUSE_BUTTON_LEFT)) {
			glfwGetCursorPos(window, &cur_pos.x, &cur_pos.y);
			float offset_x = float(cur_pos.x - m_last_mouse_pos.x) * m_sensitivity;
			float offset_y = float(cur_pos.y - m_last_mouse_pos.y) * m_sensitivity;

			m_yaw -= offset_x;
			m_pitch -= offset_y;

			m_pitch = glm::clamp(m_pitch, -PIF * 0.5f, PIF * 0.5f);
			m_yaw = glm::mod(m_yaw, PIF * 2);
		}
	}
	m_last_mouse_pos = cur_pos;
}